

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::TryTypedValue
          (Parser *this,string *name,int dtoken,bool check,Value *e,BaseType req,bool *destmatch)

{
  pointer pcVar1;
  BaseType *pBVar2;
  string *psVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined4 in_register_0000008c;
  char *in_stack_00000010;
  allocator<char> local_15a;
  allocator<char> local_159;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = (string *)CONCAT44(in_register_00000014,dtoken);
  if ((*in_stack_00000010 != '\0') ||
     (iVar6 = (int)CONCAT71(in_register_00000009,check),
     *(int *)((long)&name->field_2 + 0xc) != iVar6)) {
    __assert_fail("*destmatch == false && dtoken == token_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x815,
                  "CheckedError flatbuffers::Parser::TryTypedValue(const std::string *, int, bool, Value &, BaseType, bool *)"
                 );
  }
  pBVar2 = (BaseType *)CONCAT44(in_register_0000008c,req);
  *in_stack_00000010 = '\x01';
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(in_register_0000008c,req) + 0x20);
  std::__cxx11::string::_M_assign((string *)pbVar7);
  if ((char)e == '\0') {
    if (*pBVar2 == BASE_TYPE_NONE) {
      *pBVar2 = (BaseType)destmatch;
      goto LAB_0010fe61;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"type mismatch: expecting: ",&local_159);
    pcVar4 = TypeName(*pBVar2);
    std::operator+(&local_d0,&local_f0,pcVar4);
    std::operator+(&local_b0,&local_d0,", found: ");
    psVar3 = local_158;
    pcVar4 = TypeName((BaseType)destmatch);
    std::operator+(&local_90,&local_b0,pcVar4);
    std::operator+(&local_70,&local_90,", name: ");
    if (psVar3 == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_15a);
    }
    else {
      std::__cxx11::string::string((string *)&local_110,psVar3);
    }
    std::operator+(&local_50,&local_70,&local_110);
    std::operator+(&local_130,&local_50,", value: ");
    std::operator+(&local_150,&local_130,pbVar7);
    Error(this,name);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    pbVar7 = &local_f0;
LAB_0010ffc6:
    std::__cxx11::string::~string((string *)pbVar7);
  }
  else {
LAB_0010fe61:
    if ((iVar6 != 0x103) && (*pBVar2 - BASE_TYPE_FLOAT < 2)) {
      lVar5 = std::__cxx11::string::find_first_of((char *)pbVar7,0x1409c8);
      if ((lVar5 != -1) &&
         ((((ulong)(lVar5 + BASE_TYPE_UTYPE) < (ulong)*(undefined8 *)(pBVar2 + 10) &&
           (pcVar1 = (pbVar7->_M_dataplus)._M_p, pcVar1[lVar5] == '0')) &&
          ((pcVar1[lVar5 + BASE_TYPE_UTYPE] & 0xdfU) == 0x58)))) {
        lVar5 = std::__cxx11::string::find_first_of((char *)pbVar7,0x13faf0);
        if (lVar5 == -1) {
          std::operator+(&local_130,
                         "invalid number, the exponent suffix of hexadecimal floating-point literals is mandatory: \""
                         ,pbVar7);
          std::operator+(&local_150,&local_130,"\"");
          Error(this,name);
          std::__cxx11::string::~string((string *)&local_150);
          pbVar7 = &local_130;
          goto LAB_0010ffc6;
        }
      }
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TryTypedValue(const std::string *name, int dtoken,
                                   bool check, Value &e, BaseType req,
                                   bool *destmatch) {
  FLATBUFFERS_ASSERT(*destmatch == false && dtoken == token_);
  *destmatch = true;
  e.constant = attribute_;
  // Check token match
  if (!check) {
    if (e.type.base_type == BASE_TYPE_NONE) {
      e.type.base_type = req;
    } else {
      return Error(std::string("type mismatch: expecting: ") +
                   TypeName(e.type.base_type) + ", found: " + TypeName(req) +
                   ", name: " + (name ? *name : "") + ", value: " + e.constant);
    }
  }
  // The exponent suffix of hexadecimal float-point number is mandatory.
  // A hex-integer constant is forbidden as an initializer of float number.
  if ((kTokenFloatConstant != dtoken) && IsFloat(e.type.base_type)) {
    const auto &s = e.constant;
    const auto k = s.find_first_of("0123456789.");
    if ((std::string::npos != k) && (s.length() > (k + 1)) &&
        (s[k] == '0' && is_alpha_char(s[k + 1], 'X')) &&
        (std::string::npos == s.find_first_of("pP", k + 2))) {
      return Error(
          "invalid number, the exponent suffix of hexadecimal "
          "floating-point literals is mandatory: \"" +
          s + "\"");
    }
  }
  NEXT();
  return NoError();
}